

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionTime>::emplace<QTzTransitionTime_const&>
          (QPodArrayOps<QTzTransitionTime> *this,qsizetype i,QTzTransitionTime *args)

{
  long lVar1;
  qint64 qVar2;
  qint64 qVar3;
  bool bVar4;
  qsizetype qVar5;
  QTzTransitionTime *pQVar6;
  qint64 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QTzTransitionTime> *in_RDI;
  long in_FS_OFFSET;
  QTzTransitionTime *where;
  GrowthPosition pos;
  bool detach;
  QTzTransitionTime tmp;
  QArrayDataPointer<QTzTransitionTime> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar8;
  QArrayDataPointer<QTzTransitionTime> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QArrayDataPointer<QTzTransitionTime>::needsDetach(in_stack_ffffffffffffffc0);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffcc);
  if (!bVar4) {
    if ((in_RSI == in_RDI->size) &&
       (qVar5 = QArrayDataPointer<QTzTransitionTime>::freeSpaceAtEnd
                          ((QArrayDataPointer<QTzTransitionTime> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pQVar6 = QArrayDataPointer<QTzTransitionTime>::end(in_stack_ffffffffffffffc0);
      pQVar6->atMSecsSinceEpoch = *in_RDX;
      *(qint64 *)&pQVar6->ruleIndex = in_RDX[1];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_007608fd;
    }
    if ((in_RSI == 0) &&
       (qVar5 = QArrayDataPointer<QTzTransitionTime>::freeSpaceAtBegin
                          ((QArrayDataPointer<QTzTransitionTime> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pQVar6 = QArrayDataPointer<QTzTransitionTime>::begin
                         ((QArrayDataPointer<QTzTransitionTime> *)0x760826);
      pQVar6[-1].atMSecsSinceEpoch = *in_RDX;
      *(qint64 *)&pQVar6[-1].ruleIndex = in_RDX[1];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_007608fd;
    }
  }
  qVar2 = *in_RDX;
  qVar3 = in_RDX[1];
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<QTzTransitionTime>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QTzTransitionTime **)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffc0);
  pQVar6 = createHole((QPodArrayOps<QTzTransitionTime> *)this_00,
                      (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
                      CONCAT44(uVar8,uVar7));
  pQVar6->atMSecsSinceEpoch = qVar2;
  *(qint64 *)&pQVar6->ruleIndex = qVar3;
LAB_007608fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }